

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_uint64_partial_array(coda_cursor *cursor,long offset,long length,uint64_t *dst)

{
  int iVar1;
  char *pcVar2;
  long *in_FS_OFFSET;
  coda_type *local_58;
  long local_50;
  long num_elements;
  long i;
  coda_type *type;
  uint64_t *puStack_30;
  coda_native_type read_type;
  uint64_t *dst_local;
  long length_local;
  long offset_local;
  coda_cursor *cursor_local;
  
  puStack_30 = dst;
  dst_local = (uint64_t *)length;
  length_local = offset;
  offset_local = (long)cursor;
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x1372);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (uint64_t *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x1377);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_58 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_58 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    i = (long)local_58;
    if (local_58->type_class == 1) {
      if (*(int *)(*in_FS_OFFSET + -0x1208) != 0) {
        iVar1 = coda_cursor_get_num_elements(cursor,&local_50);
        if (iVar1 != 0) {
          return -1;
        }
        if ((length_local < 0) || (local_50 <= length_local)) {
          coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",length_local,
                         local_50);
          return -1;
        }
        if (local_50 < length_local + (long)dst_local) {
          coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",
                         length_local,dst_local,local_50);
          return -1;
        }
      }
      iVar1 = get_array_element_read_type((coda_type *)i,(coda_native_type *)((long)&type + 4));
      if (iVar1 == 0) {
        switch(type._4_4_) {
        case coda_native_type_uint8:
          iVar1 = read_uint8_partial_array
                            ((coda_cursor *)offset_local,length_local,(long)dst_local,
                             (uint8_t *)puStack_30);
          num_elements = (long)dst_local;
          if (iVar1 != 0) {
            return -1;
          }
          while (num_elements = num_elements + -1, -1 < num_elements) {
            puStack_30[num_elements] = (ulong)*(byte *)((long)puStack_30 + num_elements);
          }
          break;
        default:
          pcVar2 = coda_type_get_native_type_name(type._4_4_);
          coda_set_error(-0x69,"can not read %s data using a uint64 data type",pcVar2);
          return -1;
        case coda_native_type_uint16:
          iVar1 = read_uint16_partial_array
                            ((coda_cursor *)offset_local,length_local,(long)dst_local,
                             (uint16_t *)puStack_30);
          num_elements = (long)dst_local;
          if (iVar1 != 0) {
            return -1;
          }
          while (num_elements = num_elements + -1, -1 < num_elements) {
            puStack_30[num_elements] = (ulong)*(ushort *)((long)puStack_30 + num_elements * 2);
          }
          break;
        case coda_native_type_uint32:
          iVar1 = read_uint32_partial_array
                            ((coda_cursor *)offset_local,length_local,(long)dst_local,
                             (uint32_t *)puStack_30);
          num_elements = (long)dst_local;
          if (iVar1 != 0) {
            return -1;
          }
          while (num_elements = num_elements + -1, -1 < num_elements) {
            puStack_30[num_elements] = (ulong)*(uint *)((long)puStack_30 + num_elements * 4);
          }
          break;
        case coda_native_type_uint64:
          iVar1 = read_uint64_partial_array
                            ((coda_cursor *)offset_local,length_local,(long)dst_local,puStack_30);
          if (iVar1 != 0) {
            return -1;
          }
        }
        cursor_local._4_4_ = 0;
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      pcVar2 = coda_type_get_class_name(local_58->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar2);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_uint64_partial_array(const coda_cursor *cursor, long offset, long length,
                                                      uint64_t *dst)
{
    coda_native_type read_type;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint32:
            if (read_uint32_partial_array(cursor, offset, length, (uint32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint32_t *)dst)[i];
            }
            break;
        case coda_native_type_uint64:
            if (read_uint64_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a uint64 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}